

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_container_grow(array_container_t *container,int32_t min,_Bool preserve)

{
  uint uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = 0x1000;
  if (0x1000 < min) {
    iVar6 = 0x10000;
  }
  uVar1 = container->capacity;
  if ((int)uVar1 < 1) {
    iVar2 = 0;
  }
  else if ((int)uVar1 < 0x40) {
    iVar2 = uVar1 * 2;
  }
  else {
    if ((int)uVar1 < 0x400) {
      uVar5 = uVar1 >> 1;
    }
    else {
      uVar5 = uVar1 >> 2;
    }
    iVar2 = uVar1 + uVar5;
  }
  if (iVar2 < iVar6) {
    iVar6 = iVar2;
  }
  if (iVar2 < min) {
    iVar6 = min;
  }
  container->capacity = iVar6;
  puVar4 = container->array;
  if (preserve) {
    puVar3 = (uint16_t *)(*global_memory_hook.realloc)(puVar4,(long)iVar6 * 2);
    container->array = puVar3;
    if (puVar3 == (uint16_t *)0x0) {
      (*global_memory_hook.free)(puVar4);
      return;
    }
  }
  else {
    if (puVar4 != (uint16_t *)0x0) {
      (*global_memory_hook.free)(puVar4);
    }
    puVar4 = (uint16_t *)(*global_memory_hook.malloc)((long)iVar6 * 2);
    container->array = puVar4;
  }
  return;
}

Assistant:

void array_container_grow(array_container_t *container, int32_t min,
                          bool preserve) {
    int32_t max = (min <= DEFAULT_MAX_SIZE ? DEFAULT_MAX_SIZE : 65536);
    int32_t new_capacity = clamp(grow_capacity(container->capacity), min, max);

    container->capacity = new_capacity;
    uint16_t *array = container->array;

    if (preserve) {
        container->array =
            (uint16_t *)roaring_realloc(array, new_capacity * sizeof(uint16_t));
        if (container->array == NULL) roaring_free(array);
    } else {
        // Jon Strabala reports that some tools complain otherwise
        if (array != NULL) {
            roaring_free(array);
        }
        container->array =
            (uint16_t *)roaring_malloc(new_capacity * sizeof(uint16_t));
    }

    // if realloc fails, we have container->array == NULL.
}